

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS
ref_phys_euler_dual_flux(REF_GRID ref_grid,REF_INT ldim,REF_DBL *primitive_dual,REF_DBL *dual_flux)

{
  uint uVar1;
  int iVar2;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL flux [5];
  REF_DBL local_88;
  REF_DBL state [5];
  REF_DBL local_58;
  REF_DBL direction [3];
  REF_INT nvar;
  REF_INT dir;
  REF_INT node;
  REF_INT i;
  REF_DBL *dual_flux_local;
  REF_DBL *primitive_dual_local;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  
  if (ldim % 2 == 0) {
    if (ldim < 10) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x144,
             "ref_phys_euler_dual_flux","expect ldim >= 10");
      ref_grid_local._4_4_ = 1;
    }
    else {
      direction[2]._0_4_ = ldim / 2;
      for (nvar = 0; nvar < ref_grid->node->max; nvar = nvar + 1) {
        if (((-1 < nvar) && (nvar < ref_grid->node->max)) && (-1 < ref_grid->node->global[nvar])) {
          for (dir = 0; dir < 5; dir = dir + 1) {
            dual_flux[dir + nvar * 0x14] = primitive_dual[direction[2]._0_4_ + dir + ldim * nvar];
          }
        }
      }
      for (nvar = 0; nvar < ref_grid->node->max; nvar = nvar + 1) {
        if (((-1 < nvar) && (nvar < ref_grid->node->max)) && (-1 < ref_grid->node->global[nvar])) {
          for (dir = 0; dir < 0xf; dir = dir + 1) {
            dual_flux[dir + 5 + nvar * 0x14] = 0.0;
          }
        }
      }
      for (nvar = 0; nvar < ref_grid->node->max; nvar = nvar + 1) {
        if (((-1 < nvar) && (nvar < ref_grid->node->max)) && (-1 < ref_grid->node->global[nvar])) {
          for (dir = 0; dir < 5; dir = dir + 1) {
            state[(long)dir + -1] = primitive_dual[dir + ldim * nvar];
          }
          for (direction[2]._4_4_ = 0; direction[2]._4_4_ < 3;
              direction[2]._4_4_ = direction[2]._4_4_ + 1) {
            local_58 = 0.0;
            direction[0] = 0.0;
            direction[1] = 0.0;
            direction[(long)direction[2]._4_4_ + -1] = 1.0;
            uVar1 = ref_phys_euler(&local_88,&local_58,(REF_DBL *)&stack0xffffffffffffff48);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x15b,"ref_phys_euler_dual_flux",(ulong)uVar1,"euler");
              return uVar1;
            }
            for (dir = 0; dir < 5; dir = dir + 1) {
              iVar2 = dir + 5 + direction[2]._4_4_ * 5 + nvar * 0x14;
              dual_flux[iVar2] = flux[(long)dir + -1] + dual_flux[iVar2];
            }
          }
        }
      }
      ref_grid_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x143,
           "ref_phys_euler_dual_flux","expect even ldim");
    ref_grid_local._4_4_ = 1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_euler_dual_flux(REF_GRID ref_grid, REF_INT ldim,
                                            REF_DBL *primitive_dual,
                                            REF_DBL *dual_flux) {
  REF_INT i, node, dir, nvar;
  REF_DBL direction[3], state[5], flux[5];

  RAS(0 == ldim % 2, "expect even ldim");
  RAS(ldim >= 10, "expect ldim >= 10");
  nvar = ldim / 2;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 5; i++) {
      dual_flux[i + 20 * node] = primitive_dual[nvar + i + ldim * node];
    }
  }

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 15; i++) {
      dual_flux[5 + i + 20 * node] = 0.0;
    }
  }

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 5; i++) {
      state[i] = primitive_dual[i + ldim * node];
    }
    for (dir = 0; dir < 3; dir++) {
      direction[0] = 0;
      direction[1] = 0;
      direction[2] = 0;
      direction[dir] = 1;
      RSS(ref_phys_euler(state, direction, flux), "euler");
      for (i = 0; i < 5; i++) {
        dual_flux[i + 5 + 5 * dir + 20 * node] += flux[i];
      }
    }
  }
  return REF_SUCCESS;
}